

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

CType google::protobuf::compiler::cpp::EffectiveStringCType(FieldDescriptor *field,Options *options)

{
  CType CVar1;
  LogMessage *other;
  FieldDescriptor *local_58;
  code *local_50 [7];
  
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_50[0] = FieldDescriptor::TypeOnceInit;
    local_58 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),local_50,&local_58);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4) != 9) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
               ,0x3e0);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)local_50,
                       "CHECK failed: field->cpp_type() == FieldDescriptor::CPPTYPE_STRING: ");
    internal::LogFinisher::operator=((LogFinisher *)&local_58,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_50);
  }
  CVar1 = FieldOptions_CType_STRING;
  if (options->opensource_runtime == false) {
    CVar1 = *(CType *)(*(long *)(field + 0x38) + 0x48);
  }
  return CVar1;
}

Assistant:

FieldOptions::CType EffectiveStringCType(const FieldDescriptor* field,
                                         const Options& options) {
  GOOGLE_DCHECK(field->cpp_type() == FieldDescriptor::CPPTYPE_STRING);
  if (options.opensource_runtime) {
    // Open-source protobuf release only supports STRING ctype.
    return FieldOptions::STRING;
  } else {
    // Google-internal supports all ctypes.
    return field->options().ctype();
  }
}